

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ipoint.cpp
# Opt level: O3

int ON_2iVector::Compare(ON_2iVector *lhs,ON_2iVector *rhs)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((rhs->x <= lhs->x) && (uVar1 = 1, lhs->x <= rhs->x)) {
    uVar1 = 0xffffffff;
    if (rhs->y <= lhs->y) {
      uVar1 = (uint)(rhs->y < lhs->y);
    }
  }
  return uVar1;
}

Assistant:

int ON_2iVector::Compare(
  const ON_2iVector& lhs,
  const ON_2iVector& rhs
)
{
  if (lhs.x < rhs.x)
    return -1;
  if (lhs.x > rhs.x)
    return 1;
  if (lhs.y < rhs.y)
    return -1;
  if (lhs.y > rhs.y)
    return 1;
  return 0;
}